

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difftime.c
# Opt level: O1

double difftime(time_t __time1,time_t __time0)

{
  long lVar1;
  unsigned_long t0;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  lVar1 = __time1 - __time0;
  if (__time1 < __time0) {
    lVar1 = __time0 - __time1;
    auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar2._0_8_ = lVar1;
    auVar2._12_4_ = 0x45300000;
    return -((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
  }
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  return (auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
}

Assistant:

double difftime( time_t time1, time_t time0 )
{
    /* If we want to avoid rounding errors and overflows, we need to be
       careful with the exact type of time_t being unknown to us.
       The code below is based on tzcode's difftime.c, which is in the
       public domain, so clarified as of 1996-06-05 by Arthur David Olson.
    */

    /* If double is large enough, simply covert and substract
       (assuming that the larger type has more precision).
    */
    if ( sizeof( time_t ) < sizeof( double ) )
    {
        return ( double )time1 - ( double )time0;
    }

    /* The difference of two unsigned values cannot overflow if the
       minuend is greater or equal to the subtrahend.
    */
    if ( ! _PDCLIB_TYPE_SIGNED( time_t ) )
    {
        return ( time1 >= time0 ) ? ( double )( time1 - time0 ) : -( double )( time0 - time1 );
    }

    /* Use uintmax_t if wide enough. */
    if ( sizeof( time_t ) <= sizeof( _PDCLIB_uintmax_t ) )
    {
        _PDCLIB_uintmax_t t1 = time1, t0 = time0;
        return ( time1 >= time0 ) ? t1 - t0 : -( double )( t0 - t1 );
    }

    /* If both times have the same sign, their difference cannot overflow. */
    if ( ( time1 < 0 ) == ( time0 < 0 ) )
    {
        return time1 - time0;
    }

    /* The times have opposite signs, and uintmax_t is too narrow.
       This suffers from double rounding; attempt to lessen that
       by using long double temporaries.
    */
    {
        long double t1 = time1, t0 = time0;
        return t1 - t0;
    }
}